

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_utils.h
# Opt level: O2

void sunfprintf_real(FILE *fp,SUNOutputFormat fmt,int start,char *name,sunrealtype value)

{
  undefined4 in_register_00000014;
  
  if (fmt != SUN_OUTPUTFORMAT_TABLE) {
    fputc(0x2c,(FILE *)fp);
    fprintf((FILE *)fp,"%s,% .15e",value,CONCAT44(in_register_00000014,start));
    return;
  }
  fprintf((FILE *)fp,"%-*s = %.15g\n",0x1d,CONCAT44(in_register_00000014,start));
  return;
}

Assistant:

static inline void sunfprintf_real(FILE* fp, SUNOutputFormat fmt,
                                   sunbooleantype start, const char* name,
                                   sunrealtype value)
{
  if (fmt == SUN_OUTPUTFORMAT_TABLE)
  {
    fprintf(fp, "%-*s = " SUN_FORMAT_G "\n", SUN_TABLE_WIDTH, name, value);
  }
  else
  {
    if (!start) { fprintf(fp, ","); }
    fprintf(fp, "%s," SUN_FORMAT_E, name, value);
  }
}